

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageInsertCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iCol;
  long *plVar1;
  long lVar2;
  int iVar3;
  int nToken_00;
  long lVar4;
  int iPos;
  
  plVar1 = *(long **)(*pContext + 8);
  if (((tflags & 1U) == 0) || (*(int *)((long)pContext + 0xc) == 0)) {
    *(int *)((long)pContext + 0xc) = *(int *)((long)pContext + 0xc) + 1;
  }
  nToken_00 = 0x8000;
  if (nToken < 0x8000) {
    nToken_00 = nToken;
  }
  iCol = *(int *)((long)pContext + 8);
  iPos = *(int *)((long)pContext + 0xc) + -1;
  lVar2 = *plVar1;
  iVar3 = sqlite3Fts5HashWrite((Fts5Hash *)plVar1[3],plVar1[5],iCol,iPos,'0',pToken,nToken_00);
  if ((0 < *(int *)(lVar2 + 0x30)) && (iVar3 == 0)) {
    lVar4 = 1;
    do {
      iVar3 = sqlite3Fts5IndexCharlenToBytelen
                        (pToken,nToken_00,*(int *)(*(long *)(lVar2 + 0x38) + -4 + lVar4 * 4));
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = sqlite3Fts5HashWrite
                          ((Fts5Hash *)plVar1[3],plVar1[5],iCol,iPos,(char)lVar4 + '0',pToken,iVar3)
        ;
      }
    } while ((lVar4 < *(int *)(lVar2 + 0x30)) && (lVar4 = lVar4 + 1, iVar3 == 0));
  }
  return iVar3;
}

Assistant:

static int fts5StorageInsertCallback(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5InsertCtx *pCtx = (Fts5InsertCtx*)pContext;
  Fts5Index *pIdx = pCtx->pStorage->pIndex;
  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }
  return sqlite3Fts5IndexWrite(pIdx, pCtx->iCol, pCtx->szCol-1, pToken, nToken);
}